

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

char * convertLatin1toUTF8(char *source)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *local_30;
  char *tp;
  char *target;
  char *sp;
  size_t size;
  char *source_local;
  
  sp = (char *)0x1;
  for (target = source; *target != '\0'; target = target + 1) {
    iVar1 = 1;
    if (((int)*target & 0x80U) != 0) {
      iVar1 = 2;
    }
    sp = sp + iVar1;
  }
  pcVar2 = (char *)_glfw_calloc((size_t)sp,1);
  local_30 = pcVar2;
  for (target = source; *target != '\0'; target = target + 1) {
    sVar3 = encodeUTF8(local_30,(int)*target);
    local_30 = local_30 + sVar3;
  }
  return pcVar2;
}

Assistant:

static char* convertLatin1toUTF8(const char* source)
{
    size_t size = 1;
    const char* sp;

    for (sp = source;  *sp;  sp++)
        size += (*sp & 0x80) ? 2 : 1;

    char* target = _glfw_calloc(size, 1);
    char* tp = target;

    for (sp = source;  *sp;  sp++)
        tp += encodeUTF8(tp, *sp);

    return target;
}